

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Assimp::FBX::PropertyGet<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,FBX *this,PropertyTable *in,string *name,bool *result,bool useTemplate)

{
  Property *this_00;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar1;
  
  this_00 = PropertyTable::Get((PropertyTable *)this,(string *)in);
  if (((this_00 != (Property *)0x0) ||
      ((((char)result != '\0' && (*(PropertyTable **)(this + 0x60) != (PropertyTable *)0x0)) &&
       (this_00 = PropertyTable::Get(*(PropertyTable **)(this + 0x60),(string *)in),
       this_00 != (Property *)0x0)))) &&
     (pTVar1 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>(this_00),
     pTVar1 != (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0)) {
    *(undefined1 *)&(name->_M_dataplus)._M_p = 1;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pTVar1->value);
    return __return_storage_ptr__;
  }
  *(undefined1 *)&(name->_M_dataplus)._M_p = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, bool& result, bool useTemplate=false ) {
    const Property* prop = in.Get(name);
    if( nullptr == prop) {
        if ( ! useTemplate ) {
            result = false;
            return T();
        }
        const PropertyTable* templ = in.TemplateProps();
        if ( nullptr == templ ) {
            result = false;
            return T();
        }
        prop = templ->Get(name);
        if ( nullptr == prop ) {
            result = false;
            return T();
        }
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        result = false;
        return T();
    }

    result = true;
    return tprop->Value();
}